

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderMaxPatchVertices::compareResults
          (TessellationShaderMaxPatchVertices *this,char *description,GLfloat *ref_fv)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  float fVar5;
  MessageBuilder local_1c0;
  int local_3c;
  byte local_35;
  int i;
  bool test_failed;
  float *pfStack_30;
  GLfloat epsilon;
  GLfloat *resultFloats;
  Functions *gl;
  GLfloat *ref_fv_local;
  char *description_local;
  TessellationShaderMaxPatchVertices *this_local;
  
  gl = (Functions *)ref_fv;
  ref_fv_local = (GLfloat *)description;
  description_local = (char *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  resultFloats = (GLfloat *)CONCAT44(extraout_var,iVar1);
  pfStack_30 = (float *)0x0;
  pfStack_30 = (float *)(**(code **)(resultFloats + 0x340))(0x8c8e,0,0x20,1);
  dVar2 = (**(code **)(resultFloats + 0x200))();
  glu::checkError(dVar2,"glMapBufferRange(floats) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x296);
  i = 0x3727c5ac;
  local_35 = 0;
  local_3c = 0;
  do {
    if (3 < local_3c) {
LAB_015f4c40:
      (**(code **)(resultFloats + 0x59c))(0x8c8e);
      dVar2 = (**(code **)(resultFloats + 0x200))();
      glu::checkError(dVar2,"glUnmapBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x2af);
      return (bool)((local_35 ^ 0xff) & 1);
    }
    fVar5 = de::abs<float>(pfStack_30[local_3c] -
                           *(float *)((long)&gl->activeShaderProgram + (long)local_3c * 4));
    if (1e-05 < fVar5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char **)&ref_fv_local);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [19])0x2b195f0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2b6cfbc);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pfStack_30);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pfStack_30 + 1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pfStack_30 + 2);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pfStack_30 + 3);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b47c71);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [40])"are different from the expected values ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2b6cfbc);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)gl);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)((long)&gl->activeShaderProgram + 4))
      ;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)&gl->activeTexture);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)((long)&gl->activeTexture + 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c156ab);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      local_35 = 1;
      goto LAB_015f4c40;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

bool TessellationShaderMaxPatchVertices::compareResults(const char* description, glw::GLfloat ref_fv[4])
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	const glw::GLfloat*   resultFloats = DE_NULL;

	resultFloats = (const glw::GLfloat*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
		(sizeof(glw::GLfloat) /* GLfloat size */ * 4 /* components */ * OUTPUT_VERTEX_COUNT), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(floats) failed");

	/* Comparison of vec4. */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_failed = false;

	for (int i = 0; i < 4 /* components */; i++)
	{
		if (de::abs(resultFloats[i] - ref_fv[i]) > epsilon)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

			m_testCtx.getLog() << tcu::TestLog::Message << description << " captured results "
							   << "vec4(" << resultFloats[0] << ", " << resultFloats[1] << ", " << resultFloats[2]
							   << ", " << resultFloats[3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << ref_fv[0] << ", " << ref_fv[1] << ", " << ref_fv[2] << ", " << ref_fv[3]
							   << ")." << tcu::TestLog::EndMessage;

			test_failed = true;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return !test_failed;
}